

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t
XXH3_len_17to128_64b(xxh_u8 *input,size_t len,xxh_u8 *secret,size_t secretSize,XXH64_hash_t seed)

{
  XXH64_hash_t XVar1;
  ulong in_RSI;
  xxh_u8 *in_RDI;
  xxh_u8 *unaff_retaddr;
  xxh_u64 acc;
  
  if (0x20 < in_RSI) {
    if (0x40 < in_RSI) {
      if (0x60 < in_RSI) {
        XXH3_mix16B(unaff_retaddr,in_RDI,in_RSI);
        XXH3_mix16B(unaff_retaddr,in_RDI,in_RSI);
      }
      XXH3_mix16B(unaff_retaddr,in_RDI,in_RSI);
      XXH3_mix16B(unaff_retaddr,in_RDI,in_RSI);
    }
    XXH3_mix16B(unaff_retaddr,in_RDI,in_RSI);
    XXH3_mix16B(unaff_retaddr,in_RDI,in_RSI);
  }
  XXH3_mix16B(unaff_retaddr,in_RDI,in_RSI);
  XXH3_mix16B(unaff_retaddr,in_RDI,in_RSI);
  XVar1 = XXH3_avalanche(0x10a46e);
  return XVar1;
}

Assistant:

XXH_FORCE_INLINE XXH_PUREF XXH64_hash_t
XXH3_len_17to128_64b(const xxh_u8* XXH_RESTRICT input, size_t len,
                     const xxh_u8* XXH_RESTRICT secret, size_t secretSize,
                     XXH64_hash_t seed)
{
    XXH_ASSERT(secretSize >= XXH3_SECRET_SIZE_MIN); (void)secretSize;
    XXH_ASSERT(16 < len && len <= 128);

    {   xxh_u64 acc = len * XXH_PRIME64_1;
#if XXH_SIZE_OPT >= 1
        /* Smaller and cleaner, but slightly slower. */
        unsigned int i = (unsigned int)(len - 1) / 32;
        do {
            acc += XXH3_mix16B(input+16 * i, secret+32*i, seed);
            acc += XXH3_mix16B(input+len-16*(i+1), secret+32*i+16, seed);
        } while (i-- != 0);
#else
        if (len > 32) {
            if (len > 64) {
                if (len > 96) {
                    acc += XXH3_mix16B(input+48, secret+96, seed);
                    acc += XXH3_mix16B(input+len-64, secret+112, seed);
                }
                acc += XXH3_mix16B(input+32, secret+64, seed);
                acc += XXH3_mix16B(input+len-48, secret+80, seed);
            }
            acc += XXH3_mix16B(input+16, secret+32, seed);
            acc += XXH3_mix16B(input+len-32, secret+48, seed);
        }
        acc += XXH3_mix16B(input+0, secret+0, seed);
        acc += XXH3_mix16B(input+len-16, secret+16, seed);
#endif
        return XXH3_avalanche(acc);
    }
}